

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_t.cpp
# Opt level: O1

void __thiscall deci::array_t::array_t(array_t *this,array_t *copy)

{
  pointer *pppvVar1;
  pointer ppvVar2;
  iterator __position;
  int iVar3;
  undefined4 extraout_var;
  pointer ppvVar4;
  value_t *local_30;
  
  (this->super_value_t).hash = 1;
  (this->super_value_t)._vptr_value_t = (_func_int **)&PTR_DoHashing_00107d00;
  (this->elements).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->elements).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->elements).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<deci::value_t_*,_std::allocator<deci::value_t_*>_>::reserve
            (&this->elements,
             (long)(copy->elements).
                   super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(copy->elements).
                   super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  ppvVar4 = (copy->elements).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppvVar2 = (copy->elements).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppvVar4 != ppvVar2) {
    do {
      iVar3 = (*(*ppvVar4)->_vptr_value_t[2])();
      local_30 = (value_t *)CONCAT44(extraout_var,iVar3);
      __position._M_current =
           (this->elements).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->elements).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<deci::value_t*,std::allocator<deci::value_t*>>::
        _M_realloc_insert<deci::value_t*>
                  ((vector<deci::value_t*,std::allocator<deci::value_t*>> *)&this->elements,
                   __position,&local_30);
      }
      else {
        *__position._M_current = local_30;
        pppvVar1 = &(this->elements).
                    super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppvVar1 = *pppvVar1 + 1;
      }
      ppvVar4 = ppvVar4 + 1;
    } while (ppvVar4 != ppvVar2);
  }
  return;
}

Assistant:

array_t::array_t(const array_t& copy):value_t(),elements() {
      this->elements.reserve(copy.elements.size());
      for (auto el: copy.elements) {
        this->elements.push_back(el->Copy());
      }
    }